

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O1

bool google::protobuf::io::ReadHexDigits(char *ptr,int len,uint32 *result)

{
  int iVar1;
  uint32 uVar2;
  char *pcVar3;
  char cVar4;
  bool bVar5;
  
  *result = 0;
  if (len == 0) {
    return false;
  }
  bVar5 = len < 1;
  if ((0 < len) && (cVar4 = *ptr, cVar4 != '\0')) {
    uVar2 = *result;
    pcVar3 = ptr + 1;
    do {
      iVar1 = (int)cVar4;
      if ((byte)(cVar4 - 0x30U) < 10) {
        iVar1 = iVar1 + -0x30;
      }
      else if ((byte)(cVar4 + 0x9fU) < 0x1a) {
        iVar1 = iVar1 + -0x57;
      }
      else {
        iVar1 = iVar1 + -0x37;
        if (0x19 < (byte)(cVar4 + 0xbfU)) {
          iVar1 = -1;
        }
      }
      uVar2 = uVar2 * 0x10 + iVar1;
      *result = uVar2;
      bVar5 = ptr + len <= pcVar3;
      if (bVar5) {
        return bVar5;
      }
      cVar4 = *pcVar3;
      pcVar3 = pcVar3 + 1;
    } while (cVar4 != '\0');
  }
  return bVar5;
}

Assistant:

static bool ReadHexDigits(const char* ptr, int len, uint32* result) {
  *result = 0;
  if (len == 0) return false;
  for (const char* end = ptr + len; ptr < end; ++ptr) {
    if (*ptr == '\0') return false;
    *result = (*result << 4) + DigitValue(*ptr);
  }
  return true;
}